

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_vector_derefs.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_68aa4::vector_deref_visitor::visit_enter
          (vector_deref_visitor *this,ir_assignment *ir)

{
  glsl_type *type;
  ir_dereference_array *piVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ir_dereference_variable *this_00;
  ir_assignment *piVar5;
  ir_dereference *piVar6;
  ir_assignment *piVar7;
  ir_expression *piVar8;
  ir_swizzle *piVar9;
  ir_rvalue *op0;
  uint local_c4;
  operand oStack_c0;
  uint component [1];
  operand local_b8;
  operand local_b0;
  ir_assignment *local_a8;
  ir_assignment *cond_assign_1;
  operand local_98;
  ir_assignment *local_90;
  ir_assignment *cond_assign;
  ir_dereference_variable *src_temp_deref;
  ir_rvalue *lhs_clone;
  ir_constant *cmp_index;
  operand oStack_68;
  uint i;
  deref local_60;
  ir_variable *local_58;
  ir_variable *arr_index;
  ir_variable *src_temp;
  ir_constant *old_index_constant;
  void *mem_ctx;
  ir_rvalue *new_lhs;
  ir_variable *var;
  ir_dereference_array *deref;
  ir_assignment *ir_local;
  vector_deref_visitor *this_local;
  
  deref = (ir_dereference_array *)ir;
  ir_local = (ir_assignment *)this;
  if ((ir->lhs == (ir_dereference *)0x0) ||
     ((ir->lhs->super_ir_rvalue).super_ir_instruction.ir_type != ir_type_dereference_array)) {
    this_local._4_4_ = ir_rvalue_enter_visitor::visit_enter(&this->super_ir_rvalue_enter_visitor,ir)
    ;
  }
  else {
    var = (ir_variable *)ir->lhs;
    bVar2 = glsl_type::is_vector(*(glsl_type **)(var->name + 0x20));
    if (bVar2) {
      iVar3 = (*(var->super_ir_instruction)._vptr_ir_instruction[8])();
      new_lhs = (ir_rvalue *)CONCAT44(extraout_var,iVar3);
      if (((new_lhs[1].super_ir_instruction.ir_type >> 0xc & 0xf) == 2) ||
         ((new_lhs[1].super_ir_instruction.ir_type >> 0xc & 0xf) == 3)) {
        this_local._4_4_ =
             ir_rvalue_enter_visitor::visit_enter
                       (&this->super_ir_rvalue_enter_visitor,(ir_assignment *)deref);
      }
      else {
        mem_ctx = var->name;
        old_index_constant = (ir_constant *)ralloc_parent(deref);
        src_temp = (ir_variable *)
                   (**(code **)(**(long **)var->name_storage + 0x30))
                             (*(long **)var->name_storage,old_index_constant,0);
        if ((ir_constant *)src_temp == (ir_constant *)0x0) {
          if ((*(int *)&(this->super_ir_rvalue_enter_visitor).super_ir_rvalue_base_visitor.
                        super_ir_hierarchical_visitor.field_0x34 == 1) &&
             (iVar3 = (*(var->super_ir_instruction)._vptr_ir_instruction[8])(),
             (*(uint *)(CONCAT44(extraout_var_00,iVar3) + 0x40) >> 0xc & 0xf) == 5)) {
            arr_index = ir_builder::ir_factory::make_temp
                                  (&this->factory,deref->array->type,"scalar_tmp");
            exec_node::insert_before
                      (&(deref->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                        super_exec_node,(this->factory).instructions);
            piVar1 = deref;
            this_00 = (ir_dereference_variable *)exec_node::operator_new(0x30,old_index_constant);
            ir_dereference_variable::ir_dereference_variable(this_00,arr_index);
            ir_assignment::set_lhs((ir_assignment *)piVar1,(ir_rvalue *)this_00);
            local_58 = ir_builder::ir_factory::make_temp
                                 (&this->factory,*(glsl_type **)(*(long *)var->name_storage + 0x20),
                                  "index_tmp");
            ir_builder::deref::deref(&local_60,local_58);
            ir_builder::operand::operand(&stack0xffffffffffffff98,*(ir_rvalue **)var->name_storage);
            piVar5 = ir_builder::assign(local_60,oStack_68);
            ir_builder::ir_factory::emit(&this->factory,&piVar5->super_ir_instruction);
            for (cmp_index._4_4_ = 0;
                cmp_index._4_4_ < *(byte *)(*(long *)((long)mem_ctx + 0x20) + 8);
                cmp_index._4_4_ = cmp_index._4_4_ + 1) {
              lhs_clone = &ir_constant::zero((this->factory).mem_ctx,
                                             *(glsl_type **)(*(long *)var->name_storage + 0x20))->
                           super_ir_rvalue;
              (((ir_constant *)lhs_clone)->value).u[0] = cmp_index._4_4_;
              src_temp_deref =
                   (ir_dereference_variable *)
                   (**(code **)(*mem_ctx + 0x20))(mem_ctx,(this->factory).mem_ctx,0);
              piVar5 = (ir_assignment *)exec_node::operator_new(0x30,old_index_constant);
              ir_dereference_variable::ir_dereference_variable
                        ((ir_dereference_variable *)piVar5,arr_index);
              cond_assign = piVar5;
              if (*(int *)((long)mem_ctx + 0x18) == 5) {
                piVar7 = (ir_assignment *)exec_node::operator_new(0x40,old_index_constant);
                ir_builder::operand::operand(&local_b0,(ir_rvalue *)src_temp_deref);
                piVar9 = ir_builder::swizzle(local_b0,cmp_index._4_4_,1);
                piVar5 = cond_assign;
                ir_builder::operand::operand(&local_b8,local_58);
                ir_builder::operand::operand(&stack0xffffffffffffff40,lhs_clone);
                piVar8 = ir_builder::equal(local_b8,oStack_c0);
                ir_assignment::ir_assignment
                          (piVar7,&piVar9->super_ir_rvalue,(ir_rvalue *)piVar5,
                           &piVar8->super_ir_rvalue);
                local_a8 = piVar7;
                ir_builder::ir_factory::emit(&this->factory,(ir_instruction *)piVar7);
              }
              else {
                piVar6 = ir_instruction::as_dereference((ir_instruction *)src_temp_deref);
                if (piVar6 == (ir_dereference *)0x0) {
                  __assert_fail("lhs_clone->as_dereference()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_vector_derefs.cpp"
                                ,0x72,
                                "virtual ir_visitor_status (anonymous namespace)::vector_deref_visitor::visit_enter(ir_assignment *)"
                               );
                }
                piVar7 = (ir_assignment *)exec_node::operator_new(0x40,old_index_constant);
                piVar6 = ir_instruction::as_dereference((ir_instruction *)src_temp_deref);
                piVar5 = cond_assign;
                ir_builder::operand::operand(&local_98,local_58);
                ir_builder::operand::operand((operand *)&cond_assign_1,lhs_clone);
                piVar8 = ir_builder::equal(local_98,(operand)cond_assign_1);
                ir_assignment::ir_assignment
                          (piVar7,piVar6,(ir_rvalue *)piVar5,&piVar8->super_ir_rvalue,
                           1 << ((byte)cmp_index._4_4_ & 0x1f));
                local_90 = piVar7;
                ir_builder::ir_factory::emit(&this->factory,(ir_instruction *)piVar7);
              }
            }
            exec_node::insert_after
                      (&(deref->super_ir_dereference).super_ir_rvalue.super_ir_instruction.
                        super_exec_node,(this->factory).instructions);
          }
          else {
            piVar8 = (ir_expression *)exec_node::operator_new(0x58,old_index_constant);
            type = *(glsl_type **)((long)mem_ctx + 0x20);
            op0 = (ir_rvalue *)(**(code **)(*mem_ctx + 0x20))(mem_ctx,old_index_constant,0);
            ir_expression::ir_expression
                      (piVar8,0x96,type,op0,deref->array,*(ir_rvalue **)var->name_storage,
                       (ir_rvalue *)0x0);
            deref->array = (ir_rvalue *)piVar8;
            *(byte *)&deref[1].super_ir_dereference.super_ir_rvalue.super_ir_instruction.
                      _vptr_ir_instruction =
                 *(byte *)&deref[1].super_ir_dereference.super_ir_rvalue.super_ir_instruction.
                           _vptr_ir_instruction & 0xf0 |
                 (char)(1 << (*(byte *)(*(long *)((long)mem_ctx + 0x20) + 8) & 0x1f)) - 1U & 0xf;
            ir_assignment::set_lhs((ir_assignment *)deref,(ir_rvalue *)mem_ctx);
          }
        }
        else if (*(int *)((long)mem_ctx + 0x18) == 5) {
          local_c4 = ir_constant::get_uint_component((ir_constant *)src_temp,0);
          piVar1 = deref;
          piVar9 = (ir_swizzle *)exec_node::operator_new(0x38,old_index_constant);
          ir_swizzle::ir_swizzle(piVar9,(ir_rvalue *)mem_ctx,&local_c4,1);
          ir_assignment::set_lhs((ir_assignment *)piVar1,(ir_rvalue *)piVar9);
        }
        else {
          ir_assignment::set_lhs((ir_assignment *)deref,(ir_rvalue *)mem_ctx);
          uVar4 = ir_constant::get_uint_component((ir_constant *)src_temp,0);
          *(byte *)&deref[1].super_ir_dereference.super_ir_rvalue.super_ir_instruction.
                    _vptr_ir_instruction =
               *(byte *)&deref[1].super_ir_dereference.super_ir_rvalue.super_ir_instruction.
                         _vptr_ir_instruction & 0xf0 | (byte)(1 << ((byte)uVar4 & 0x1f)) & 0xf;
        }
        this_local._4_4_ =
             ir_rvalue_enter_visitor::visit_enter
                       (&this->super_ir_rvalue_enter_visitor,(ir_assignment *)deref);
      }
    }
    else {
      this_local._4_4_ =
           ir_rvalue_enter_visitor::visit_enter
                     (&this->super_ir_rvalue_enter_visitor,(ir_assignment *)deref);
    }
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
vector_deref_visitor::visit_enter(ir_assignment *ir)
{
   if (!ir->lhs || ir->lhs->ir_type != ir_type_dereference_array)
      return ir_rvalue_enter_visitor::visit_enter(ir);

   ir_dereference_array *const deref = (ir_dereference_array *) ir->lhs;
   if (!deref->array->type->is_vector())
      return ir_rvalue_enter_visitor::visit_enter(ir);

   /* SSBOs and shared variables are backed by memory and may be accessed by
    * multiple threads simultaneously.  It's not safe to lower a single
    * component store to a load-vec-store because it may race with writes to
    * other components.
    */
   ir_variable *var = deref->variable_referenced();
   if (var->data.mode == ir_var_shader_storage ||
       var->data.mode == ir_var_shader_shared)
      return ir_rvalue_enter_visitor::visit_enter(ir);

   ir_rvalue *const new_lhs = deref->array;

   void *mem_ctx = ralloc_parent(ir);
   ir_constant *old_index_constant =
      deref->array_index->constant_expression_value(mem_ctx);
   if (!old_index_constant) {
      if (shader_stage == MESA_SHADER_TESS_CTRL &&
          deref->variable_referenced()->data.mode == ir_var_shader_out) {
         /* Tessellation control shader outputs act as if they have memory
          * backing them and if we have writes from multiple threads
          * targeting the same vec4 (this can happen for patch outputs), the
          * load-vec-store pattern of ir_triop_vector_insert doesn't work.
          * Instead, we have to lower to a series of conditional write-masked
          * assignments.
          */
         ir_variable *const src_temp =
            factory.make_temp(ir->rhs->type, "scalar_tmp");

         /* The newly created variable declaration goes before the assignment
          * because we're going to set it as the new LHS.
          */
         ir->insert_before(factory.instructions);
         ir->set_lhs(new(mem_ctx) ir_dereference_variable(src_temp));

         ir_variable *const arr_index =
            factory.make_temp(deref->array_index->type, "index_tmp");
         factory.emit(assign(arr_index, deref->array_index));

         for (unsigned i = 0; i < new_lhs->type->vector_elements; i++) {
            ir_constant *const cmp_index =
               ir_constant::zero(factory.mem_ctx, deref->array_index->type);
            cmp_index->value.u[0] = i;

            ir_rvalue *const lhs_clone = new_lhs->clone(factory.mem_ctx, NULL);
            ir_dereference_variable *const src_temp_deref =
               new(mem_ctx) ir_dereference_variable(src_temp);

            if (new_lhs->ir_type != ir_type_swizzle) {
               assert(lhs_clone->as_dereference());
               ir_assignment *cond_assign =
                  new(mem_ctx) ir_assignment(lhs_clone->as_dereference(),
                                             src_temp_deref,
                                             equal(arr_index, cmp_index),
                                             WRITEMASK_X << i);
               factory.emit(cond_assign);
            } else {
               ir_assignment *cond_assign =
                  new(mem_ctx) ir_assignment(swizzle(lhs_clone, i, 1),
                                             src_temp_deref,
                                             equal(arr_index, cmp_index));
               factory.emit(cond_assign);
            }
         }
         ir->insert_after(factory.instructions);
      } else {
         ir->rhs = new(mem_ctx) ir_expression(ir_triop_vector_insert,
                                              new_lhs->type,
                                              new_lhs->clone(mem_ctx, NULL),
                                              ir->rhs,
                                              deref->array_index);
         ir->write_mask = (1 << new_lhs->type->vector_elements) - 1;
         ir->set_lhs(new_lhs);
      }
   } else if (new_lhs->ir_type != ir_type_swizzle) {
      ir->set_lhs(new_lhs);
      ir->write_mask = 1 << old_index_constant->get_uint_component(0);
   } else {
      /* If the "new" LHS is a swizzle, use the set_lhs helper to instead
       * swizzle the RHS.
       */
      unsigned component[1] = { old_index_constant->get_uint_component(0) };
      ir->set_lhs(new(mem_ctx) ir_swizzle(new_lhs, component, 1));
   }

   return ir_rvalue_enter_visitor::visit_enter(ir);
}